

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_section.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  section *section;
  ostream *poVar2;
  int iVar3;
  allocator<char> local_e1;
  string local_e0;
  note_section_accessor note_writer;
  elfio reader;
  
  if (argc == 2) {
    ELFIO::elfio::elfio(&reader);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&note_writer,argv[1],(allocator<char> *)&local_e0);
    bVar1 = ELFIO::elfio::load(&reader,(string *)&note_writer,false);
    std::__cxx11::string::~string((string *)&note_writer);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&note_writer,".note.ELFIO",(allocator<char> *)&local_e0);
      section = ELFIO::elfio::Sections::add(&reader.sections,(string *)&note_writer);
      std::__cxx11::string::~string((string *)&note_writer);
      (*section->_vptr_section[6])(section,&ELFIO::SHT_NOTE);
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::
      note_section_accessor_template(&note_writer,&reader,section);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"Created by ELFIO",&local_e1);
      ELFIO::note_section_accessor_template<ELFIO::section,_&ELFIO::section::get_size>::add_note
                (&note_writer,1,&local_e0,"My data",8);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"./result.elf",&local_e1);
      ELFIO::elfio::save(&reader,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&note_writer.note_start_positions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      iVar3 = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t find or process ELF file ");
      poVar2 = std::operator<<(poVar2,argv[1]);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar3 = 2;
    }
    ELFIO::elfio::~elfio(&reader);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: add_section <elf_file>");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 2 ) {
        std::cout << "Usage: add_section <elf_file>" << std::endl;
        return 1;
    }

    // Create an elfio reader
    elfio reader;

    // Load ELF data
    if ( !reader.load( argv[1] ) ) {
        std::cout << "Can't find or process ELF file " << argv[1] << std::endl;
        return 2;
    }

    // Create additional section at the end of the file
    section* note_sec = reader.sections.add( ".note.ELFIO" );
    note_sec->set_type( SHT_NOTE );
    note_section_accessor note_writer( reader, note_sec );
    note_writer.add_note( 0x01, "Created by ELFIO", "My data", 8 );

    reader.save( "./result.elf" );

    return 0;
}